

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O2

optional<long> __thiscall
node::MiniMiner::CalculateTotalBumpFees(MiniMiner *this,CFeeRate *target_feerate)

{
  long lVar1;
  undefined8 *puVar2;
  key_type *pkVar3;
  size_type sVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  CAmount CVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  _Storage<long,_true> unaff_RBX;
  long lVar9;
  CTxIn *input;
  uchar *__k;
  _Rb_tree_header *p_Var10;
  long lVar11;
  long in_FS_OFFSET;
  optional<CFeeRate> target_feerate_00;
  optional<long> oVar12;
  iterator parent_it;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> has_been_processed;
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  to_process;
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ancestors;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_ready_to_calculate == true) {
    target_feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._8_8_ = 1;
    target_feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload =
         (_Storage<CFeeRate,_true>)target_feerate->nSatoshisPerK;
    BuildMockTemplate(this,target_feerate_00);
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &ancestors._M_t._M_impl.super__Rb_tree_header._M_header;
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ancestors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    to_process._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &to_process._M_t._M_impl.super__Rb_tree_header._M_header;
    to_process._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    to_process._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    to_process._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var10 = &(this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header;
    to_process._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         to_process._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var5 = (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header
                  ._M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      sVar4 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                        (&this->m_in_block,(key_type *)(p_Var5 + 1));
      if (sVar4 == 0) {
        has_been_processed._M_t._M_impl._0_8_ =
             std::
             _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
             ::find(&(this->m_entries_by_txid)._M_t,(key_type *)(p_Var5 + 1));
        if ((_Rb_tree_header *)has_been_processed._M_t._M_impl._0_8_ != p_Var10) {
          std::
          _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
          ::
          _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                    ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                      *)&to_process,
                     (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                     &has_been_processed);
          std::
          _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
          ::
          _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                    ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                      *)&ancestors,
                     (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                     &has_been_processed);
        }
      }
    }
    has_been_processed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &has_been_processed._M_t._M_impl.super__Rb_tree_header._M_header;
    has_been_processed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    has_been_processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    has_been_processed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    has_been_processed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         has_been_processed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var6 = ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
          p_Var5 = to_process._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
          to_process._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      puVar2 = *(undefined8 **)
                (*(long *)(to_process._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) +
                0x40);
      pkVar3 = (key_type *)puVar2[1];
      for (__k = (uchar *)*puVar2; (key_type *)__k != pkVar3; __k = __k + 0x68) {
        parent_it._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
             ::find(&(this->m_entries_by_txid)._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)parent_it._M_node != p_Var10) {
          sVar4 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                            (&has_been_processed,(key_type *)__k);
          if (sVar4 == 0) {
            std::
            _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
            ::
            _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                      ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                        *)&to_process,&parent_it);
          }
          std::
          _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
          ::
          _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                    ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                      *)&ancestors,&parent_it);
        }
      }
      std::
      _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
      _M_insert_unique<uint256_const&>
                ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                  *)&has_been_processed,(uint256 *)((long)puVar2 + 0x39));
      std::
      _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                          *)&to_process,(const_iterator)p_Var5);
    }
    lVar9 = 0;
    p_Var10 = &ancestors._M_t._M_impl.super__Rb_tree_header;
    for (p_Var5 = ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var10;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      lVar9 = lVar9 + *(long *)(*(long *)(p_Var5 + 1) + 0x50);
    }
    lVar11 = 0;
    for (; (_Rb_tree_header *)p_Var6 != p_Var10;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
      lVar11 = lVar11 + *(long *)(*(long *)(p_Var6 + 1) + 0x60);
    }
    CVar7 = CFeeRate::GetFee(target_feerate,(uint32_t)lVar9);
    unaff_RBX._M_value = CVar7 - lVar11;
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&has_been_processed._M_t);
    std::
    _Rb_tree<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::~_Rb_tree(&to_process._M_t);
    std::
    _Rb_tree<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::~_Rb_tree(&ancestors._M_t);
    uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar8 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = uVar8;
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = unaff_RBX._M_value;
    return (optional<long>)
           oVar12.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CAmount> MiniMiner::CalculateTotalBumpFees(const CFeeRate& target_feerate)
{
    if (!m_ready_to_calculate) return std::nullopt;
    // Build a block template until the target feerate is hit.
    BuildMockTemplate(target_feerate);

    // All remaining ancestors that are not part of m_in_block must be bumped, but no other relatives
    std::set<MockEntryMap::iterator, IteratorComparator> ancestors;
    std::set<MockEntryMap::iterator, IteratorComparator> to_process;
    for (const auto& [txid, outpoints] : m_requested_outpoints_by_txid) {
        // Skip any ancestors that already have a miner score higher than the target feerate
        // (already "made it" into the block)
        if (m_in_block.count(txid)) continue;
        auto iter = m_entries_by_txid.find(txid);
        if (iter == m_entries_by_txid.end()) continue;
        to_process.insert(iter);
        ancestors.insert(iter);
    }

    std::set<uint256> has_been_processed;
    while (!to_process.empty()) {
        auto iter = to_process.begin();
        const CTransaction& tx = (*iter)->second.GetTx();
        for (const auto& input : tx.vin) {
            if (auto parent_it{m_entries_by_txid.find(input.prevout.hash)}; parent_it != m_entries_by_txid.end()) {
                if (!has_been_processed.count(input.prevout.hash)) {
                    to_process.insert(parent_it);
                }
                ancestors.insert(parent_it);
            }
        }
        has_been_processed.insert(tx.GetHash());
        to_process.erase(iter);
    }
    const auto ancestor_package_size = std::accumulate(ancestors.cbegin(), ancestors.cend(), int64_t{0},
        [](int64_t sum, const auto it) {return sum + it->second.GetTxSize();});
    const auto ancestor_package_fee = std::accumulate(ancestors.cbegin(), ancestors.cend(), CAmount{0},
        [](CAmount sum, const auto it) {return sum + it->second.GetModifiedFee();});
    return target_feerate.GetFee(ancestor_package_size) - ancestor_package_fee;
}